

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.h
# Opt level: O2

void __thiscall PropertyDef::~PropertyDef(PropertyDef *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->inPrivateClass).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->notify).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->user).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->stored).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->scriptable).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->designable).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->reset).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->bind).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->write).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->read).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->member).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->type).d);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this);
  return;
}

Assistant:

bool stdCppSet() const {
        if (name.isEmpty())
            return false;
        QByteArray s("set");
        s += QtMiscUtils::toAsciiUpper(name[0]);
        s += name.mid(1);
        return (s == write);
    }